

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  size_type *psVar1;
  cmCPackLog *logger;
  bool bVar2;
  bool bVar3;
  bool genPostRm;
  bool permissionStrictPolicy;
  char *pcVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  size_t sVar7;
  string strGenWDIR;
  allocator<char> local_55b;
  allocator<char> local_55a;
  allocator<char> local_559;
  string shlibsfilename;
  string postinst;
  string postrm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  DebGenerator gen;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  char *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shlibsfilename._M_dataplus._M_p = (pointer)&shlibsfilename.field_2;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shlibsfilename,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&shlibsfilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,pcVar4,(allocator<char> *)&postrm);
  cmsys::SystemTools::LowerCase((string *)&gen,&strGenWDIR);
  postinst._M_dataplus._M_p = (pointer)&postinst.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postinst,"Package","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&postinst);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postinst._M_dataplus._M_p != &postinst.field_2) {
    operator_delete(postinst._M_dataplus._M_p,postinst.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &gen.OutputName._M_string_length;
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shlibsfilename._M_dataplus._M_p != &shlibsfilename.field_2) {
    operator_delete(shlibsfilename._M_dataplus._M_p,shlibsfilename.field_2._M_allocated_capacity + 1
                   );
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Version","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SECTION","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Section","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Priority","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Architecture","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Maintainer","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Description","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  pcVar4 = (char *)pmVar5->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar4,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Source","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Depends","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Recommends","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Suggests","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Homepage","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Pre-Depends","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Enhances","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Breaks","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Conflicts","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Provides","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Replaces","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    pcVar6 = (char *)pmVar5->_M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar6,(ulong)pcVar4);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"GEN_WDIR","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,pcVar4,(allocator<char> *)&shlibsfilename);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  shlibsfilename._M_dataplus._M_p = (pointer)&shlibsfilename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shlibsfilename,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&shlibsfilename);
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SHLIBS","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS","");
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (bVar2 && pcVar4 != (char *)0x0) {
    bVar2 = *pcVar4 != '\0';
  }
  else {
    bVar2 = false;
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar2 != false) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&gen,&shlibsfilename,false,None);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)&strGenWDIR +
                      (int)*(undefined8 *)((long)&gen.Logger[-1].LogOutputFileName.field_2 + 8) +
                      0xc0);
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&gen,pcVar4,sVar7);
    }
    std::ios::widen((char)&gen +
                    (char)*(undefined8 *)((long)&gen.Logger[-1].LogOutputFileName.field_2 + 8));
    std::ostream::put((char)&gen);
    std::ostream::flush();
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  postinst._M_dataplus._M_p = (pointer)&postinst.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&postinst,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&postinst);
  postrm._M_dataplus._M_p = (pointer)&postrm.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&postrm,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&postrm);
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTINST","");
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar3) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,&postinst,false,None)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&gen,
               "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"configure\" ]; then\n\tldconfig\nfi\n",0x40);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTRM","");
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar3) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,&postrm,false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&gen,
               "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"remove\" ]; then\n\tldconfig\nfi\n",0x3d);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"GEN_CPACK_OUTPUT_FILE_NAME","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_559);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"CPACK_TOPLEVEL_DIRECTORY","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar4,&local_55a);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar4,&local_55b);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_180);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,shlibsfilename._M_dataplus._M_p,
             shlibsfilename._M_dataplus._M_p + shlibsfilename._M_string_length);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"GEN_CPACK_DEBIAN_GENERATE_POSTINST","");
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_1e0);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,postinst._M_dataplus._M_p,
             postinst._M_dataplus._M_p + postinst._M_string_length);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"GEN_CPACK_DEBIAN_GENERATE_POSTRM","");
  genPostRm = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_220);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,postrm._M_dataplus._M_p,
             postrm._M_dataplus._M_p + postrm._M_string_length);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA","");
  local_e0 = pcVar6;
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_260);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION","");
  permissionStrictPolicy = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,&this->packageFiles);
  anon_unknown.dwarf_1a79cd::DebGenerator::DebGenerator
            (&gen,logger,&local_98,&local_120,&local_b8,&local_d8,pcVar4,local_e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,bVar2,&local_1c0,bVar3,&local_200,genPostRm,&local_240,pcVar6,
             permissionStrictPolicy,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  bVar2 = anon_unknown.dwarf_1a79cd::DebGenerator::generate(&gen);
  anon_unknown.dwarf_1a79cd::DebGenerator::~DebGenerator(&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postrm._M_dataplus._M_p != &postrm.field_2) {
    operator_delete(postrm._M_dataplus._M_p,postrm.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postinst._M_dataplus._M_p != &postinst.field_2) {
    operator_delete(postinst._M_dataplus._M_p,postinst.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shlibsfilename._M_dataplus._M_p != &shlibsfilename.field_2) {
    operator_delete(shlibsfilename._M_dataplus._M_p,shlibsfilename.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return (uint)bVar2;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  std::map<std::string, std::string> controlValues;

  // debian policy enforce lower case for package name
  controlValues["Package"] = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  controlValues["Version"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  controlValues["Section"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  controlValues["Priority"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  controlValues["Architecture"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  const char* debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (debian_pkg_source && *debian_pkg_source) {
    controlValues["Source"] = debian_pkg_source;
  }
  const char* debian_pkg_dep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  if (debian_pkg_dep && *debian_pkg_dep) {
    controlValues["Depends"] = debian_pkg_dep;
  }
  const char* debian_pkg_rec =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  if (debian_pkg_rec && *debian_pkg_rec) {
    controlValues["Recommends"] = debian_pkg_rec;
  }
  const char* debian_pkg_sug =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  if (debian_pkg_sug && *debian_pkg_sug) {
    controlValues["Suggests"] = debian_pkg_sug;
  }
  const char* debian_pkg_url =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  if (debian_pkg_url && *debian_pkg_url) {
    controlValues["Homepage"] = debian_pkg_url;
  }
  const char* debian_pkg_predep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  if (debian_pkg_predep && *debian_pkg_predep) {
    controlValues["Pre-Depends"] = debian_pkg_predep;
  }
  const char* debian_pkg_enhances =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  if (debian_pkg_enhances && *debian_pkg_enhances) {
    controlValues["Enhances"] = debian_pkg_enhances;
  }
  const char* debian_pkg_breaks =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  if (debian_pkg_breaks && *debian_pkg_breaks) {
    controlValues["Breaks"] = debian_pkg_breaks;
  }
  const char* debian_pkg_conflicts =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  if (debian_pkg_conflicts && *debian_pkg_conflicts) {
    controlValues["Conflicts"] = debian_pkg_conflicts;
  }
  const char* debian_pkg_provides =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  if (debian_pkg_provides && *debian_pkg_provides) {
    controlValues["Provides"] = debian_pkg_provides;
  }
  const char* debian_pkg_replaces =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  if (debian_pkg_replaces && *debian_pkg_replaces) {
    controlValues["Replaces"] = debian_pkg_replaces;
  }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));
  const std::string shlibsfilename = strGenWDIR + "/shlibs";

  const char* debian_pkg_shlibs =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SHLIBS");
  const bool gen_shibs = this->IsOn("CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS") &&
    debian_pkg_shlibs && *debian_pkg_shlibs;
  if (gen_shibs) {
    cmGeneratedFileStream out(shlibsfilename);
    out << debian_pkg_shlibs;
    out << std::endl;
  }

  const std::string postinst = strGenWDIR + "/postinst";
  const std::string postrm = strGenWDIR + "/postrm";
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST")) {
    cmGeneratedFileStream out(postinst);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"configure\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM")) {
    cmGeneratedFileStream out(postrm);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"remove\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }

  DebGenerator gen(
    Logger, this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME"), strGenWDIR,
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, gen_shibs,
    shlibsfilename, this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST"), postinst,
    this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM"), postrm,
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA"),
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    packageFiles);

  if (!gen.generate()) {
    return 0;
  }
  return 1;
}